

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs5.c
# Opt level: O3

int mbedtls_pkcs5_self_test(int verbose)

{
  uint key_length;
  int iVar1;
  mbedtls_md_info_t *md_info;
  int iVar2;
  ulong uVar3;
  mbedtls_md_context_t sha1_ctx;
  uchar key [64];
  
  mbedtls_md_init(&sha1_ctx);
  md_info = mbedtls_md_info_from_type(MBEDTLS_MD_SHA1);
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = 1;
    iVar1 = mbedtls_md_setup(&sha1_ctx,md_info,1);
    if (iVar1 == 0) {
      uVar3 = 0;
      do {
        while( true ) {
          if (verbose != 0) {
            printf("  PBKDF2 (SHA1) #%d: ",uVar3 & 0xffffffff);
          }
          key_length = key_len[uVar3];
          iVar1 = mbedtls_pkcs5_pbkdf2_hmac
                            (&sha1_ctx,password[uVar3],plen[uVar3],salt[uVar3],slen[uVar3],
                             it_cnt[uVar3],key_length,key);
          if ((iVar1 != 0) || (iVar1 = bcmp(result_key + uVar3,key,(ulong)key_length), iVar1 != 0))
          {
            if (verbose != 0) {
              puts("failed");
            }
            goto LAB_00129340;
          }
          if (verbose != 0) break;
          uVar3 = uVar3 + 1;
          if (uVar3 == 6) goto LAB_0012933e;
        }
        puts("passed");
        uVar3 = uVar3 + 1;
      } while (uVar3 != 6);
      putchar(10);
LAB_0012933e:
      iVar2 = 0;
    }
  }
LAB_00129340:
  mbedtls_md_free(&sha1_ctx);
  return iVar2;
}

Assistant:

int mbedtls_pkcs5_self_test( int verbose )
{
    mbedtls_md_context_t sha1_ctx;
    const mbedtls_md_info_t *info_sha1;
    int ret, i;
    unsigned char key[64];

    mbedtls_md_init( &sha1_ctx );

    info_sha1 = mbedtls_md_info_from_type( MBEDTLS_MD_SHA1 );
    if( info_sha1 == NULL )
    {
        ret = 1;
        goto exit;
    }

    if( ( ret = mbedtls_md_setup( &sha1_ctx, info_sha1, 1 ) ) != 0 )
    {
        ret = 1;
        goto exit;
    }

    for( i = 0; i < MAX_TESTS; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  PBKDF2 (SHA1) #%d: ", i );

        ret = mbedtls_pkcs5_pbkdf2_hmac( &sha1_ctx, password[i], plen[i], salt[i],
                                  slen[i], it_cnt[i], key_len[i], key );
        if( ret != 0 ||
            memcmp( result_key[i], key, key_len[i] ) != 0 )
        {
            if( verbose != 0 )
                mbedtls_printf( "failed\n" );

            ret = 1;
            goto exit;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

exit:
    mbedtls_md_free( &sha1_ctx );

    return( ret );
}